

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
          (QMovableArrayOps<ProString> *this,qsizetype i,ProString *args)

{
  ProString **ppPVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  ProString *pPVar4;
  ProString *pPVar5;
  long in_FS_OFFSET;
  bool bVar6;
  ProString tmp;
  Inserter local_90;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0014906d:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_68,args);
    bVar6 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size != 0;
    QArrayDataPointer<ProString>::detachAndGrow
              ((QArrayDataPointer<ProString> *)this,(uint)(i == 0 && bVar6),1,(ProString **)0x0,
               (QArrayDataPointer<ProString> *)0x0);
    if (i == 0 && bVar6) {
      ProString::ProString
                ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr +
                 -1,(ProString *)local_68);
      ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      *ppPVar1 = *ppPVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pPVar5 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      pPVar4 = pPVar5 + i;
      pPVar5 = pPVar5 + i + 1;
      local_90.nInserts = 1;
      local_90.bytes =
           ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size - i) *
           0x30;
      local_90.data = (QArrayDataPointer<ProString> *)this;
      local_90.displaceTo = pPVar5;
      memmove(pPVar5,pPVar4,local_90.bytes);
      ProString::ProString(pPVar4,(ProString *)local_68);
      local_90.displaceFrom = pPVar5;
      Inserter::~Inserter(&local_90);
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size == i) &&
       (pPVar4 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pPVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      ProString::ProString(pPVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pPVar4 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr,
         (ProString *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pPVar4)) goto LAB_0014906d;
      ProString::ProString(pPVar4 + -1,args);
      ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }